

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1e006::
ARTScanTest_scanForwardEmptyTree_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTScanTest_scanForwardEmptyTree_Test
          (ARTScanTest_scanForwardEmptyTree_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanForwardEmptyTree) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  {
    uint64_t n = 0;
    auto fn = [&n](const unodb::visitor<typename TypeParam::iterator>&) {
      n++;           // LCOV_EXCL_LINE
      return false;  // LCOV_EXCL_LINE
    };
    db.scan(fn);
    UNODB_EXPECT_EQ(0, n);
  }
  {
    uint64_t n = 0;
    const auto fn =
        [&n](const unodb::visitor<typename TypeParam::iterator>&) noexcept {
          n++;           // LCOV_EXCL_LINE
          return false;  // LCOV_EXCL_LINE
        };
    db.scan_from(0x0000, fn);
    UNODB_EXPECT_EQ(0, n);
  }
  {
    uint64_t n = 0;
    const auto fn =
        [&n](const unodb::visitor<typename TypeParam::iterator>&) noexcept {
          n++;           // LCOV_EXCL_LINE
          return false;  // LCOV_EXCL_LINE
        };
    db.scan_range(0x0000, 0xffff, fn);
    UNODB_EXPECT_EQ(0, n);
  }
}